

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# livevar_analyse.hpp
# Opt level: O2

void __thiscall optimization::livevar_analyse::Livevar_Analyse::roll_phi(Livevar_Analyse *this)

{
  MirFunction *pMVar1;
  int iVar2;
  size_type sVar3;
  iterator __position;
  _Base_ptr p_Var4;
  
  pMVar1 = this->func;
  p_Var4 = (pMVar1->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var4 == &(pMVar1->basic_blks)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    __position._M_current =
         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)p_Var4[3]._M_parent;
    while ((_Base_ptr)__position._M_current != p_Var4[3]._M_left) {
      iVar2 = (*((((__position._M_current)->_M_t).
                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t
                  .super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
                _vptr_Displayable[1])();
      if (iVar2 == 0) {
        sVar3 = std::
                set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                ::count(&this->phi_dests,
                        &(((__position._M_current)->_M_t).
                          super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest);
        if (sVar3 == 0) goto LAB_0011d3de;
        __position = std::
                     vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                     ::erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                              *)&p_Var4[3]._M_parent,(const_iterator)__position._M_current);
      }
      else {
LAB_0011d3de:
        __position._M_current = __position._M_current + 1;
      }
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

void roll_phi() {
    for (auto& blkpair : func.basic_blks) {
      for (auto iter = blkpair.second.inst.begin();
           iter != blkpair.second.inst.end();) {
        if (iter->get()->inst_kind() == mir::inst::InstKind::Assign &&
            phi_dests.count(iter->get()->dest)) {
          iter = blkpair.second.inst.erase(iter);
        } else {
          iter++;
        }
      }
    }
  }